

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
               (MinMaxState<duckdb::interval_t> *state,interval_t input,AggregateInputData *param_3)

{
  bool bVar1;
  interval_t local_18;
  
  local_18.micros = input.micros;
  local_18._0_8_ = input._0_8_;
  bVar1 = interval_t::operator>(&state->value,&local_18);
  if (bVar1) {
    (state->value).months = local_18.months;
    (state->value).days = local_18.days;
    (state->value).micros = local_18.micros;
  }
  return;
}

Assistant:

static void Execute(STATE &state, INPUT_TYPE input, AggregateInputData &) {
		if (LessThan::Operation<INPUT_TYPE>(input, state.value)) {
			state.value = input;
		}
	}